

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::draw_action(Application *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  float local_890;
  float local_88c;
  Color local_888;
  Color local_878;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  stringstream lbs_string;
  ostream local_7b0 [376];
  stringstream damping_string;
  ostream local_628 [376];
  stringstream timestep_string;
  ostream local_4a0 [376];
  stringstream integrator_string;
  ostream local_318 [376];
  stringstream actionString;
  ostream local_190 [376];
  
  iVar1 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar1 != 0) {
    if (iVar1 != 2) {
      return;
    }
    bVar3 = Timeline::isCurrentlyPlaying(&this->timeline);
    if (bVar3) {
      return;
    }
  }
  OSDText::clear(&this->textManager);
  piVar2 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_88c = 48.0;
  local_890 = 48.0;
  if ((this->super_Renderer).use_hdpi == false) {
    local_890 = 24.0;
  }
  else {
    local_88c = 112.0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&actionString);
  std::operator<<(local_190,"ACTION: ");
  if ((ulong)this->action < 9) {
    pcVar5 = &DAT_001e702c + *(int *)(&DAT_001e702c + (ulong)this->action * 4);
  }
  else {
    pcVar5 = "(none)";
  }
  std::operator<<(local_190,pcVar5);
  local_878.r = 0.3;
  local_878.g = 0.7;
  local_878.b = 0.3;
  local_878.a = 1.0;
  std::__cxx11::stringbuf::str();
  draw_string(this,local_890,local_88c,&local_7e0,0x10,&local_878);
  std::__cxx11::string::~string((string *)&local_7e0);
  if (*(int *)&(this->super_Renderer).field_0xc != 2) goto LAB_00192d8d;
  std::__cxx11::stringstream::stringstream((stringstream *)&integrator_string);
  std::operator<<(local_318,"Integrator: ");
  if (this->integrator == Forward_Euler) {
    pcVar5 = "Forward Euler";
LAB_00192b81:
    std::operator<<(local_318,pcVar5);
  }
  else if (this->integrator == Symplectic_Euler) {
    pcVar5 = "Symplectic Euler";
    goto LAB_00192b81;
  }
  local_888.r = 0.7;
  local_888.g = 0.3;
  local_888.b = 0.7;
  local_888.a = 1.0;
  std::__cxx11::stringbuf::str();
  draw_string(this,local_890,local_88c + 20.0,&local_800,0x10,&local_888);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::stringstream::stringstream((stringstream *)&timestep_string);
  std::operator<<(local_4a0,"Timestep: ");
  std::ostream::_M_insert<double>(this->timestep);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_890,local_88c + 40.0,&local_820,0x10,&local_888);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::stringstream::stringstream((stringstream *)&damping_string);
  std::operator<<(local_628,"Damping Factor: ");
  std::ostream::_M_insert<double>(this->damping_factor);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_890,local_88c + 60.0,&local_840,0x10,&local_888);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::stringstream::stringstream((stringstream *)&lbs_string);
  poVar4 = std::operator<<(local_7b0,"Linear Blend Skinning: ");
  pcVar5 = "Naive";
  if (this->useCapsuleRadius != false) {
    pcVar5 = "Threshold";
  }
  std::operator<<(poVar4,pcVar5);
  std::__cxx11::stringbuf::str();
  draw_string(this,local_890,local_88c + 80.0,&local_860,0x10,&local_888);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lbs_string);
  std::__cxx11::stringstream::~stringstream((stringstream *)&damping_string);
  std::__cxx11::stringstream::~stringstream((stringstream *)&timestep_string);
  std::__cxx11::stringstream::~stringstream((stringstream *)&integrator_string);
LAB_00192d8d:
  OSDText::render(&this->textManager);
  std::__cxx11::stringstream::~stringstream((stringstream *)&actionString);
  return;
}

Assistant:

void Application::draw_action()
{
   if( mode != MODEL_MODE && mode != ANIMATE_MODE ) return;
   if (mode == ANIMATE_MODE && timeline.isCurrentlyPlaying()) return;

  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? 48 : 24;
  const float y0 = use_hdpi ? 80 : 40;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  stringstream actionString;
  actionString << "ACTION: ";
  switch( action )
  {
     case( Action::Navigate ):
        actionString << "Navigate";
        break;
     case( Action::Edit ):
        actionString << "Edit";
        break;
     case( Action::Bevel ):
        actionString << "Bevel";
        break;
     case ( Action::CreateJoint):
        actionString << "Create Joint";
        break;
     case ( Action::Wave ):
        actionString << "Wave";
        break;
     case ( Action::Object ):
        actionString << "Object Transformation";
        break;
     case ( Action::Pose ):
        actionString << "Pose";
        break;
     case ( Action::IK ):
        actionString << "Inverse Kinematics";
        break;
     case ( Action::BoneRadius ):
        actionString << "Change Threshold Radius";
        break;
     default:
        actionString << "(none)";
        break;
  };



  Color action_color(0.3, .7, 0.3);
  draw_string( x0, y, actionString.str(), size, action_color );

  if (mode == ANIMATE_MODE) {
    stringstream integrator_string;
    integrator_string << "Integrator: ";
    switch (integrator) {
      case Integrator::Forward_Euler:
        integrator_string << "Forward Euler";
        break;
      case Integrator::Symplectic_Euler:
        integrator_string << "Symplectic Euler";
        break;
    }
    Color integrator_color(0.7, 0.3, 0.7);
    draw_string(x0, y + 20, integrator_string.str(), size, integrator_color);
    stringstream timestep_string;
    timestep_string << "Timestep: " << timestep;
    draw_string(x0, y + 40, timestep_string.str(), size, integrator_color);
    stringstream damping_string;
    damping_string << "Damping Factor: " << damping_factor;
    draw_string(x0, y + 60, damping_string.str(), size, integrator_color);
    stringstream lbs_string;
    lbs_string << "Linear Blend Skinning: " << (useCapsuleRadius? "Threshold" : "Naive");
    draw_string(x0, y + 80, lbs_string.str(), size, integrator_color);
  }

  // // No selection --> no messages.
  // if (!scene->has_selection()) {
  //   draw_string(x0, y, "No mesh feature is selected", size, text_color);
  //   y += inc;
  // } else {
  //   DynamicScene::SelectionInfo selectionInfo = scene->get_selection_info();
  //   for (const string& s : selectionInfo) {
  //     size_t split = s.find_first_of(":");
  //     if (split != string::npos) {
  //       split++;
  //       string s1 = s.substr(0,split);
  //       string s2 = s.substr(split);
  //       draw_string(x0, y, s1, size, text_color);
  //       draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
  //     } else {
  //       draw_string(x0, y, s, size, text_color);
  //     }
  //     y += inc;
  //   }
  // }

  // // -- First draw a lovely black rectangle.

  // glPushAttrib(GL_VIEWPORT_BIT);
  // glViewport(0, 0, screenW, screenH);

  // glMatrixMode(GL_PROJECTION);
  // glPushMatrix();
  // glLoadIdentity();
  // glOrtho(0, screenW, screenH, 0, 0, 1);

  // glMatrixMode(GL_MODELVIEW);
  // glPushMatrix();
  // glLoadIdentity();
  // glTranslatef(0, 0, -1);

  // // -- Black with opacity .8;

  // glColor4f(0.0, 0.0, 0.0, 0.8);

  // float min_x = x0 - 32;
  // float min_y = y0 - 32;
  // float max_x = screenW;
  // float max_y = y;

  // float z = 0.0;

  // glDisable(GL_DEPTH_TEST);
  // glDisable(GL_LIGHTING);

  // glBegin(GL_QUADS);

  // glVertex3f(min_x, min_y, z);
  // glVertex3f(min_x, max_y, z);
  // glVertex3f(max_x, max_y, z);
  // glVertex3f(max_x, min_y, z);
  // glEnd();

  // glMatrixMode(GL_PROJECTION);
  // glPopMatrix();

  // glMatrixMode(GL_MODELVIEW);
  // glPopMatrix();

  // glPopAttrib();

  // glEnable(GL_LIGHTING);
  // glEnable(GL_DEPTH_TEST);

  textManager.render();
}